

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSample::Deserialize(ReservoirSample *this,Deserializer *deserializer)

{
  unsigned_long sample_count;
  ReservoirSample *this_00;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
  reservoir_chunk;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> local_20;
  
  sample_count = Deserializer::ReadPropertyWithDefault<unsigned_long>
                           (deserializer,200,"sample_count");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>>
            ((Deserializer *)&reservoir_chunk,(field_id_t)deserializer,(char *)0xc9);
  this_00 = (ReservoirSample *)operator_new(0x58);
  local_20._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
  super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true,_true>
        )(__uniq_ptr_data<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true,_true>
          )reservoir_chunk.
           super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
           .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl;
  reservoir_chunk.
  super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
  super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
       (__uniq_ptr_data<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true,_true>
        )0x0;
  ReservoirSample(this_00,sample_count,
                  (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   *)&local_20);
  ::std::unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
  ~unique_ptr(&local_20);
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)this_00;
  ::std::unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
  ~unique_ptr(&reservoir_chunk.
               super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
             );
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSample::Deserialize(Deserializer &deserializer) {
	auto sample_count = deserializer.ReadPropertyWithDefault<idx_t>(200, "sample_count");
	auto reservoir_chunk = deserializer.ReadPropertyWithDefault<unique_ptr<ReservoirChunk>>(201, "reservoir_chunk");
	auto result = duckdb::unique_ptr<ReservoirSample>(new ReservoirSample(sample_count, std::move(reservoir_chunk)));
	return std::move(result);
}